

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_horizontal_8_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  short sVar42;
  short sVar43;
  undefined4 uVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar55 [16];
  short sVar56;
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar63;
  short sVar64;
  short sVar65;
  ushort uVar66;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ushort uVar76;
  undefined1 auVar69 [16];
  undefined8 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar81;
  short sVar83;
  short sVar84;
  short sVar85;
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short sVar92;
  undefined1 auVar93 [16];
  short sVar95;
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  __m128i pq [4];
  
  uVar1 = *(undefined8 *)(s + -(long)(p * 4));
  lVar38 = (long)(p * 3);
  uVar77 = *(undefined8 *)(s + -lVar38);
  lVar41 = (long)(p * 2);
  uVar2 = *(undefined8 *)(s + -lVar41);
  lVar39 = (long)p;
  uVar3 = *(undefined8 *)(s + -lVar39);
  uVar4 = *(undefined8 *)(s + -lVar39);
  local_b8 = *(undefined8 *)(s + -lVar41);
  uStack_b0 = *(undefined8 *)(s + lVar39);
  uStack_a0 = *(undefined8 *)(s + lVar41);
  uStack_90 = *(undefined8 *)(s + lVar38);
  uVar5 = *(undefined8 *)s;
  auVar103._8_8_ = local_b8;
  auVar103._0_8_ = uVar4;
  local_a8 = *(undefined8 *)(s + -lVar38);
  local_98 = *(undefined8 *)(s + -(long)(p * 4));
  auVar57 = *(undefined1 (*) [16])_blimit;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar57._0_13_;
  auVar9[0xe] = auVar57[7];
  auVar12[0xc] = auVar57[6];
  auVar12._0_12_ = auVar57._0_12_;
  auVar12._13_2_ = auVar9._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar57._0_11_;
  auVar15._12_3_ = auVar12._12_3_;
  auVar18[10] = auVar57[5];
  auVar18._0_10_ = auVar57._0_10_;
  auVar18._11_4_ = auVar15._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar57._0_9_;
  auVar21._10_5_ = auVar18._10_5_;
  auVar24[8] = auVar57[4];
  auVar24._0_8_ = auVar57._0_8_;
  auVar24._9_6_ = auVar21._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  auVar32._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar32[0] = auVar57[3];
  auVar32._9_6_ = 0;
  auVar33._1_10_ = SUB1510(auVar32 << 0x30,5);
  auVar33[0] = auVar57[2];
  auVar33._11_4_ = 0;
  auVar86._3_12_ = SUB1512(auVar33 << 0x20,3);
  auVar86[2] = auVar57[1];
  auVar86[0] = auVar57[0];
  auVar86[1] = 0;
  auVar86[0xf] = 0;
  auVar57 = *(undefined1 (*) [16])_limit;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar57._0_13_;
  auVar7[0xe] = auVar57[7];
  auVar10[0xc] = auVar57[6];
  auVar10._0_12_ = auVar57._0_12_;
  auVar10._13_2_ = auVar7._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar57._0_11_;
  auVar13._12_3_ = auVar10._12_3_;
  auVar16[10] = auVar57[5];
  auVar16._0_10_ = auVar57._0_10_;
  auVar16._11_4_ = auVar13._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar57._0_9_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar22[8] = auVar57[4];
  auVar22._0_8_ = auVar57._0_8_;
  auVar22._9_6_ = auVar19._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar22._8_7_;
  auVar34._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar34[0] = auVar57[3];
  auVar34._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar35[0] = auVar57[2];
  auVar35._11_4_ = 0;
  auVar25[2] = auVar57[1];
  auVar25._0_2_ = auVar57._0_2_;
  auVar25._3_12_ = SUB1512(auVar35 << 0x20,3);
  auVar78._0_2_ = auVar57._0_2_ & 0xff;
  auVar78._2_13_ = auVar25._2_13_;
  auVar78[0xf] = 0;
  auVar57 = *(undefined1 (*) [16])_thresh;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar57._0_13_;
  auVar8[0xe] = auVar57[7];
  auVar11[0xc] = auVar57[6];
  auVar11._0_12_ = auVar57._0_12_;
  auVar11._13_2_ = auVar8._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar57._0_11_;
  auVar14._12_3_ = auVar11._12_3_;
  auVar17[10] = auVar57[5];
  auVar17._0_10_ = auVar57._0_10_;
  auVar17._11_4_ = auVar14._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar57._0_9_;
  auVar20._10_5_ = auVar17._10_5_;
  auVar23[8] = auVar57[4];
  auVar23._0_8_ = auVar57._0_8_;
  auVar23._9_6_ = auVar20._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar23._8_7_;
  auVar36._1_8_ = SUB158(auVar31 << 0x40,7);
  auVar36[0] = auVar57[3];
  auVar36._9_6_ = 0;
  auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar37[0] = auVar57[2];
  auVar37._11_4_ = 0;
  auVar90._3_12_ = SUB1512(auVar37 << 0x20,3);
  auVar90[2] = auVar57[1];
  auVar90[0] = auVar57[0];
  auVar90[1] = 0;
  auVar90[0xf] = 0;
  auVar93._8_8_ = uStack_b0;
  auVar93._0_8_ = uVar5;
  auVar96 = ZEXT416(bd - 8);
  auVar57 = psllw(auVar86,auVar96);
  auVar67 = psubusw(auVar103,auVar93);
  auVar86 = psubusw(auVar93,auVar103);
  auVar86 = auVar86 | auVar67;
  auVar78 = psllw(auVar78,auVar96);
  auVar67 = paddusw(auVar86,auVar86);
  auVar68._0_8_ = auVar67._0_8_;
  auVar68._8_8_ = 0;
  auVar87._0_2_ = auVar86._8_2_ >> 1;
  auVar87._2_2_ = auVar86._10_2_ >> 1;
  auVar87._4_2_ = auVar86._12_2_ >> 1;
  auVar87._6_2_ = auVar86._14_2_ >> 1;
  auVar87._8_8_ = 0;
  auVar67 = paddusw(auVar87,auVar68);
  auVar67 = auVar67 ^ _DAT_004dd960;
  auVar57 = auVar57 ^ _DAT_004dd960;
  auVar88._0_2_ = -(ushort)(auVar57._0_2_ < auVar67._0_2_);
  auVar88._2_2_ = -(ushort)(auVar57._2_2_ < auVar67._2_2_);
  auVar88._4_2_ = -(ushort)(auVar57._4_2_ < auVar67._4_2_);
  auVar88._6_2_ = -(ushort)(auVar57._6_2_ < auVar67._6_2_);
  auVar88._8_2_ = -(ushort)(auVar57._8_2_ < auVar67._8_2_);
  auVar88._10_2_ = -(ushort)(auVar57._10_2_ < auVar67._10_2_);
  auVar88._12_2_ = -(ushort)(auVar57._12_2_ < auVar67._12_2_);
  auVar88._14_2_ = -(ushort)(auVar57._14_2_ < auVar67._14_2_);
  auVar86 = paddusw(_DAT_00517a00,auVar78);
  auVar86 = auVar86 & auVar88;
  auVar57._8_8_ = uVar5;
  auVar57._0_8_ = uVar4;
  auVar67._8_8_ = uStack_b0;
  auVar67._0_8_ = local_b8;
  auVar89 = psubusw(auVar57,auVar67);
  auVar67 = psubusw(auVar67,auVar57);
  auVar67 = auVar67 | auVar89;
  auVar57 = psllw(auVar90,auVar96);
  sVar47 = auVar67._0_2_;
  sVar52 = auVar67._8_2_;
  auVar89._0_2_ = (ushort)(sVar52 < sVar47) * sVar47 | (ushort)(sVar52 >= sVar47) * sVar52;
  sVar49 = auVar67._2_2_;
  sVar51 = auVar67._10_2_;
  auVar89._2_2_ = (ushort)(sVar51 < sVar49) * sVar49 | (ushort)(sVar51 >= sVar49) * sVar51;
  sVar48 = auVar67._4_2_;
  sVar53 = auVar67._12_2_;
  auVar89._4_2_ = (ushort)(sVar53 < sVar48) * sVar48 | (ushort)(sVar53 >= sVar48) * sVar53;
  sVar50 = auVar67._6_2_;
  sVar54 = auVar67._14_2_;
  auVar89._6_2_ = (ushort)(sVar54 < sVar50) * sVar50 | (ushort)(sVar54 >= sVar50) * sVar54;
  sVar45 = (ushort)(0 < sVar52) * sVar52;
  auVar89._8_2_ = sVar45;
  sVar42 = (ushort)(0 < sVar51) * sVar51;
  auVar89._10_2_ = sVar42;
  sVar43 = (ushort)(0 < sVar53) * sVar53;
  auVar89._12_2_ = sVar43;
  sVar46 = (ushort)(0 < sVar54) * sVar54;
  auVar89._14_2_ = sVar46;
  sVar56 = auVar86._0_2_;
  uVar66 = (sVar56 < (short)auVar89._0_2_) * auVar89._0_2_ |
           (ushort)(sVar56 >= (short)auVar89._0_2_) * sVar56;
  sVar56 = auVar86._2_2_;
  uVar70 = (sVar56 < (short)auVar89._2_2_) * auVar89._2_2_ |
           (ushort)(sVar56 >= (short)auVar89._2_2_) * sVar56;
  sVar56 = auVar86._4_2_;
  uVar71 = (sVar56 < (short)auVar89._4_2_) * auVar89._4_2_ |
           (ushort)(sVar56 >= (short)auVar89._4_2_) * sVar56;
  sVar56 = auVar86._6_2_;
  uVar72 = (sVar56 < (short)auVar89._6_2_) * auVar89._6_2_ |
           (ushort)(sVar56 >= (short)auVar89._6_2_) * sVar56;
  sVar56 = auVar86._8_2_;
  uVar73 = (ushort)(sVar56 < sVar45) * sVar45 | (ushort)(sVar56 >= sVar45) * sVar56;
  sVar45 = auVar86._10_2_;
  uVar74 = (ushort)(sVar45 < sVar42) * sVar42 | (ushort)(sVar45 >= sVar42) * sVar45;
  sVar42 = auVar86._12_2_;
  sVar45 = auVar86._14_2_;
  uVar75 = (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
  uVar76 = (ushort)(sVar45 < sVar46) * sVar46 | (ushort)(sVar45 >= sVar46) * sVar45;
  auVar89 = auVar89 ^ _DAT_004dd960;
  auVar57 = auVar57 ^ _DAT_004dd960;
  auVar58._0_4_ =
       CONCAT22(-(ushort)(auVar57._2_2_ < auVar89._2_2_),-(ushort)(auVar57._0_2_ < auVar89._0_2_));
  lVar40 = 0x20;
  auVar67 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  do {
    auVar86 = psubusw(*(undefined1 (*) [16])(local_c8 + lVar40),
                      *(undefined1 (*) [16])((long)&local_d8 + lVar40));
    auVar90 = psubusw(*(undefined1 (*) [16])((long)&local_d8 + lVar40),
                      *(undefined1 (*) [16])(local_c8 + lVar40));
    auVar90 = auVar90 | auVar86;
    sVar42 = auVar90._0_2_;
    uVar66 = (ushort)((short)uVar66 < sVar42) * sVar42 | ((short)uVar66 >= sVar42) * uVar66;
    sVar42 = auVar90._2_2_;
    uVar70 = (ushort)((short)uVar70 < sVar42) * sVar42 | ((short)uVar70 >= sVar42) * uVar70;
    sVar42 = auVar90._4_2_;
    uVar71 = (ushort)((short)uVar71 < sVar42) * sVar42 | ((short)uVar71 >= sVar42) * uVar71;
    sVar42 = auVar90._6_2_;
    uVar72 = (ushort)((short)uVar72 < sVar42) * sVar42 | ((short)uVar72 >= sVar42) * uVar72;
    sVar42 = auVar90._8_2_;
    uVar73 = (ushort)((short)uVar73 < sVar42) * sVar42 | ((short)uVar73 >= sVar42) * uVar73;
    sVar42 = auVar90._10_2_;
    uVar74 = (ushort)((short)uVar74 < sVar42) * sVar42 | ((short)uVar74 >= sVar42) * uVar74;
    sVar42 = auVar90._12_2_;
    uVar75 = (ushort)((short)uVar75 < sVar42) * sVar42 | ((short)uVar75 >= sVar42) * uVar75;
    sVar42 = auVar90._14_2_;
    uVar76 = (ushort)((short)uVar76 < sVar42) * sVar42 | ((short)uVar76 >= sVar42) * uVar76;
    lVar40 = lVar40 + 0x10;
  } while (lVar40 != 0x40);
  auVar67 = pshuflw(auVar67,auVar67,0);
  uVar44 = auVar67._0_4_;
  auVar91._4_4_ = uVar44;
  auVar91._0_4_ = uVar44;
  auVar91._8_4_ = uVar44;
  auVar91._12_4_ = uVar44;
  auVar58._4_4_ =
       (undefined4)
       (CONCAT26(-(ushort)(auVar57._6_2_ < auVar89._6_2_),
                 CONCAT24(-(ushort)(auVar57._4_2_ < auVar89._4_2_),auVar58._0_4_)) >> 0x20);
  auVar58._8_4_ = auVar58._0_4_;
  auVar58._12_4_ = auVar58._4_4_;
  auVar107._0_2_ =
       ((short)uVar73 < (short)uVar66) * uVar66 | ((short)uVar73 >= (short)uVar66) * uVar73;
  auVar107._2_2_ =
       ((short)uVar74 < (short)uVar70) * uVar70 | ((short)uVar74 >= (short)uVar70) * uVar74;
  auVar107._4_2_ =
       ((short)uVar75 < (short)uVar71) * uVar71 | ((short)uVar75 >= (short)uVar71) * uVar75;
  auVar107._6_2_ =
       ((short)uVar76 < (short)uVar72) * uVar72 | ((short)uVar76 >= (short)uVar72) * uVar76;
  auVar107._8_2_ = (0 < (short)uVar73) * uVar73;
  auVar107._10_2_ = (0 < (short)uVar74) * uVar74;
  auVar107._12_2_ = (0 < (short)uVar75) * uVar75;
  auVar107._14_2_ = (0 < (short)uVar76) * uVar76;
  auVar57 = psubusw(auVar107,auVar78);
  auVar108._0_2_ = -(ushort)(auVar57._0_2_ == 0);
  auVar108._2_2_ = -(ushort)(auVar57._2_2_ == 0);
  auVar108._4_2_ = -(ushort)(auVar57._4_2_ == 0);
  auVar108._6_2_ = -(ushort)(auVar57._6_2_ == 0);
  auVar108._8_2_ = -(ushort)(auVar57._8_2_ == 0);
  auVar108._10_2_ = -(ushort)(auVar57._10_2_ == 0);
  auVar108._12_2_ = -(ushort)(auVar57._12_2_ == 0);
  auVar108._14_2_ = -(ushort)(auVar57._14_2_ == 0);
  auVar57 = psllw(_DAT_00517a00,ZEXT416((uint)bd));
  auVar104._8_4_ = 0xffffffff;
  auVar104._0_8_ = 0xffffffffffffffff;
  auVar104._12_4_ = 0xffffffff;
  auVar57 = paddsw(auVar57,auVar104);
  auVar57 = psubsw(auVar57,auVar91);
  auVar67 = psubsw((undefined1  [16])0x0,auVar91);
  auVar89 = psubsw(auVar103,auVar91);
  auVar90 = psubsw(auVar93,auVar91);
  auVar86 = psubsw(auVar89,auVar90);
  sVar63 = auVar57._0_2_;
  sVar42 = auVar86._0_2_;
  uVar66 = (ushort)(sVar63 < sVar42) * sVar63 | (ushort)(sVar63 >= sVar42) * sVar42;
  sVar64 = auVar57._2_2_;
  sVar42 = auVar86._2_2_;
  uVar70 = (ushort)(sVar64 < sVar42) * sVar64 | (ushort)(sVar64 >= sVar42) * sVar42;
  sVar65 = auVar57._4_2_;
  sVar42 = auVar86._4_2_;
  uVar71 = (ushort)(sVar65 < sVar42) * sVar65 | (ushort)(sVar65 >= sVar42) * sVar42;
  sVar81 = auVar57._6_2_;
  sVar42 = auVar86._6_2_;
  uVar72 = (ushort)(sVar81 < sVar42) * sVar81 | (ushort)(sVar81 >= sVar42) * sVar42;
  sVar83 = auVar57._8_2_;
  sVar42 = auVar86._8_2_;
  uVar73 = (ushort)(sVar83 < sVar42) * sVar83 | (ushort)(sVar83 >= sVar42) * sVar42;
  sVar84 = auVar57._10_2_;
  sVar42 = auVar86._10_2_;
  uVar74 = (ushort)(sVar84 < sVar42) * sVar84 | (ushort)(sVar84 >= sVar42) * sVar42;
  sVar85 = auVar57._12_2_;
  sVar42 = auVar86._12_2_;
  sVar43 = auVar86._14_2_;
  uVar75 = (ushort)(sVar85 < sVar42) * sVar85 | (ushort)(sVar85 >= sVar42) * sVar42;
  sVar6 = auVar57._14_2_;
  uVar76 = (ushort)(sVar6 < sVar43) * sVar6 | (ushort)(sVar6 >= sVar43) * sVar43;
  sVar42 = auVar67._0_2_;
  auVar97._0_2_ = (ushort)((short)uVar66 < sVar42) * sVar42 | ((short)uVar66 >= sVar42) * uVar66;
  sVar43 = auVar67._2_2_;
  auVar97._2_2_ = (ushort)((short)uVar70 < sVar43) * sVar43 | ((short)uVar70 >= sVar43) * uVar70;
  sVar46 = auVar67._4_2_;
  auVar97._4_2_ = (ushort)((short)uVar71 < sVar46) * sVar46 | ((short)uVar71 >= sVar46) * uVar71;
  sVar45 = auVar67._6_2_;
  auVar97._6_2_ = (ushort)((short)uVar72 < sVar45) * sVar45 | ((short)uVar72 >= sVar45) * uVar72;
  sVar56 = auVar67._8_2_;
  auVar97._8_2_ = (ushort)((short)uVar73 < sVar56) * sVar56 | ((short)uVar73 >= sVar56) * uVar73;
  sVar60 = auVar67._10_2_;
  auVar97._10_2_ = (ushort)((short)uVar74 < sVar60) * sVar60 | ((short)uVar74 >= sVar60) * uVar74;
  sVar61 = auVar67._12_2_;
  auVar97._12_2_ = (ushort)((short)uVar75 < sVar61) * sVar61 | ((short)uVar75 >= sVar61) * uVar75;
  sVar62 = auVar67._14_2_;
  auVar97._14_2_ = (ushort)((short)uVar76 < sVar62) * sVar62 | ((short)uVar76 >= sVar62) * uVar76;
  auVar57 = psubsw(auVar97 >> 0x40 & auVar58,auVar97);
  auVar57 = psubsw(auVar57,auVar97);
  auVar57 = psubsw(auVar57,auVar97);
  sVar92 = auVar57._0_2_;
  uVar66 = (ushort)(sVar63 < sVar92) * sVar63 | (ushort)(sVar63 >= sVar92) * sVar92;
  sVar92 = auVar57._2_2_;
  uVar70 = (ushort)(sVar64 < sVar92) * sVar64 | (ushort)(sVar64 >= sVar92) * sVar92;
  sVar92 = auVar57._4_2_;
  uVar71 = (ushort)(sVar65 < sVar92) * sVar65 | (ushort)(sVar65 >= sVar92) * sVar92;
  sVar92 = auVar57._6_2_;
  uVar72 = (ushort)(sVar81 < sVar92) * sVar81 | (ushort)(sVar81 >= sVar92) * sVar92;
  sVar92 = auVar57._8_2_;
  uVar73 = (ushort)(sVar83 < sVar92) * sVar83 | (ushort)(sVar83 >= sVar92) * sVar92;
  sVar92 = auVar57._10_2_;
  uVar74 = (ushort)(sVar84 < sVar92) * sVar84 | (ushort)(sVar84 >= sVar92) * sVar92;
  sVar92 = auVar57._12_2_;
  sVar95 = auVar57._14_2_;
  uVar75 = (ushort)(sVar85 < sVar92) * sVar85 | (ushort)(sVar85 >= sVar92) * sVar92;
  uVar76 = (ushort)(sVar6 < sVar95) * sVar6 | (ushort)(sVar6 >= sVar95) * sVar95;
  auVar101._0_2_ = (ushort)((short)uVar66 < sVar42) * sVar42 | ((short)uVar66 >= sVar42) * uVar66;
  auVar101._2_2_ = (ushort)((short)uVar70 < sVar43) * sVar43 | ((short)uVar70 >= sVar43) * uVar70;
  auVar101._4_2_ = (ushort)((short)uVar71 < sVar46) * sVar46 | ((short)uVar71 >= sVar46) * uVar71;
  auVar101._6_2_ = (ushort)((short)uVar72 < sVar45) * sVar45 | ((short)uVar72 >= sVar45) * uVar72;
  auVar101._8_2_ = (ushort)((short)uVar73 < sVar56) * sVar56 | ((short)uVar73 >= sVar56) * uVar73;
  auVar101._10_2_ = (ushort)((short)uVar74 < sVar60) * sVar60 | ((short)uVar74 >= sVar60) * uVar74;
  auVar101._12_2_ = (ushort)((short)uVar75 < sVar61) * sVar61 | ((short)uVar75 >= sVar61) * uVar75;
  auVar101._14_2_ = (ushort)((short)uVar76 < sVar62) * sVar62 | ((short)uVar76 >= sVar62) * uVar76;
  auVar101 = auVar101 & auVar108;
  auVar98._0_8_ = auVar101._0_8_;
  auVar98._8_4_ = auVar101._0_4_;
  auVar98._12_4_ = auVar101._4_4_;
  auVar57 = paddsw(auVar98,_DAT_00517a10);
  sVar92 = auVar57._0_2_;
  uVar66 = (ushort)(sVar63 < sVar92) * sVar63 | (ushort)(sVar63 >= sVar92) * sVar92;
  sVar92 = auVar57._2_2_;
  uVar70 = (ushort)(sVar64 < sVar92) * sVar64 | (ushort)(sVar64 >= sVar92) * sVar92;
  sVar92 = auVar57._4_2_;
  uVar71 = (ushort)(sVar65 < sVar92) * sVar65 | (ushort)(sVar65 >= sVar92) * sVar92;
  sVar92 = auVar57._6_2_;
  uVar72 = (ushort)(sVar81 < sVar92) * sVar81 | (ushort)(sVar81 >= sVar92) * sVar92;
  sVar92 = auVar57._8_2_;
  uVar73 = (ushort)(sVar83 < sVar92) * sVar83 | (ushort)(sVar83 >= sVar92) * sVar92;
  sVar92 = auVar57._10_2_;
  uVar74 = (ushort)(sVar84 < sVar92) * sVar84 | (ushort)(sVar84 >= sVar92) * sVar92;
  sVar92 = auVar57._12_2_;
  sVar95 = auVar57._14_2_;
  uVar75 = (ushort)(sVar85 < sVar92) * sVar85 | (ushort)(sVar85 >= sVar92) * sVar92;
  uVar76 = (ushort)(sVar6 < sVar95) * sVar6 | (ushort)(sVar6 >= sVar95) * sVar95;
  auVar99._0_2_ = (ushort)((short)uVar66 < sVar42) * sVar42 | ((short)uVar66 >= sVar42) * uVar66;
  auVar99._2_2_ = (ushort)((short)uVar70 < sVar43) * sVar43 | ((short)uVar70 >= sVar43) * uVar70;
  auVar99._4_2_ = (ushort)((short)uVar71 < sVar46) * sVar46 | ((short)uVar71 >= sVar46) * uVar71;
  auVar99._6_2_ = (ushort)((short)uVar72 < sVar45) * sVar45 | ((short)uVar72 >= sVar45) * uVar72;
  auVar99._8_2_ = (ushort)((short)uVar73 < sVar56) * sVar56 | ((short)uVar73 >= sVar56) * uVar73;
  auVar99._10_2_ = (ushort)((short)uVar74 < sVar60) * sVar60 | ((short)uVar74 >= sVar60) * uVar74;
  auVar99._12_2_ = (ushort)((short)uVar75 < sVar61) * sVar61 | ((short)uVar75 >= sVar61) * uVar75;
  auVar99._14_2_ = (ushort)((short)uVar76 < sVar62) * sVar62 | ((short)uVar76 >= sVar62) * uVar76;
  auVar57 = psraw(auVar99,3);
  auVar102._0_2_ = auVar57._0_2_ + 1;
  auVar102._2_2_ = auVar57._2_2_ + 1;
  auVar102._4_2_ = auVar57._4_2_ + 1;
  auVar102._6_2_ = auVar57._6_2_ + 1;
  auVar102._8_2_ = auVar57._0_2_ + 1;
  auVar102._10_2_ = auVar57._2_2_ + 1;
  auVar102._12_2_ = auVar57._4_2_ + 1;
  auVar102._14_2_ = auVar57._6_2_ + 1;
  auVar67 = psraw(auVar102,1);
  auVar105._8_8_ = SUB168(~auVar58 & auVar67,8);
  auVar105._0_8_ = auVar57._8_8_;
  auVar100._8_8_ = SUB168(~auVar58 & auVar67,0);
  auVar100._0_8_ = auVar57._0_8_;
  auVar57 = psubsw(auVar90,auVar100);
  auVar67 = paddsw(auVar105,auVar89);
  sVar92 = auVar57._0_2_;
  uVar66 = (ushort)(sVar63 < sVar92) * sVar63 | (ushort)(sVar63 >= sVar92) * sVar92;
  sVar92 = auVar57._2_2_;
  uVar70 = (ushort)(sVar64 < sVar92) * sVar64 | (ushort)(sVar64 >= sVar92) * sVar92;
  sVar92 = auVar57._4_2_;
  uVar71 = (ushort)(sVar65 < sVar92) * sVar65 | (ushort)(sVar65 >= sVar92) * sVar92;
  sVar92 = auVar57._6_2_;
  uVar72 = (ushort)(sVar81 < sVar92) * sVar81 | (ushort)(sVar81 >= sVar92) * sVar92;
  sVar92 = auVar57._8_2_;
  uVar73 = (ushort)(sVar83 < sVar92) * sVar83 | (ushort)(sVar83 >= sVar92) * sVar92;
  sVar92 = auVar57._10_2_;
  uVar74 = (ushort)(sVar84 < sVar92) * sVar84 | (ushort)(sVar84 >= sVar92) * sVar92;
  sVar92 = auVar57._12_2_;
  sVar95 = auVar57._14_2_;
  uVar75 = (ushort)(sVar85 < sVar92) * sVar85 | (ushort)(sVar85 >= sVar92) * sVar92;
  uVar76 = (ushort)(sVar6 < sVar95) * sVar6 | (ushort)(sVar6 >= sVar95) * sVar95;
  auVar94._0_2_ = (ushort)((short)uVar66 < sVar42) * sVar42 | ((short)uVar66 >= sVar42) * uVar66;
  auVar94._2_2_ = (ushort)((short)uVar70 < sVar43) * sVar43 | ((short)uVar70 >= sVar43) * uVar70;
  auVar94._4_2_ = (ushort)((short)uVar71 < sVar46) * sVar46 | ((short)uVar71 >= sVar46) * uVar71;
  auVar94._6_2_ = (ushort)((short)uVar72 < sVar45) * sVar45 | ((short)uVar72 >= sVar45) * uVar72;
  auVar94._8_2_ = (ushort)((short)uVar73 < sVar56) * sVar56 | ((short)uVar73 >= sVar56) * uVar73;
  auVar94._10_2_ = (ushort)((short)uVar74 < sVar60) * sVar60 | ((short)uVar74 >= sVar60) * uVar74;
  auVar94._12_2_ = (ushort)((short)uVar75 < sVar61) * sVar61 | ((short)uVar75 >= sVar61) * uVar75;
  auVar94._14_2_ = (ushort)((short)uVar76 < sVar62) * sVar62 | ((short)uVar76 >= sVar62) * uVar76;
  sVar92 = auVar67._0_2_;
  uVar66 = (ushort)(sVar63 < sVar92) * sVar63 | (ushort)(sVar63 >= sVar92) * sVar92;
  sVar63 = auVar67._2_2_;
  uVar70 = (ushort)(sVar64 < sVar63) * sVar64 | (ushort)(sVar64 >= sVar63) * sVar63;
  sVar63 = auVar67._4_2_;
  uVar71 = (ushort)(sVar65 < sVar63) * sVar65 | (ushort)(sVar65 >= sVar63) * sVar63;
  sVar63 = auVar67._6_2_;
  uVar72 = (ushort)(sVar81 < sVar63) * sVar81 | (ushort)(sVar81 >= sVar63) * sVar63;
  sVar63 = auVar67._8_2_;
  uVar73 = (ushort)(sVar83 < sVar63) * sVar83 | (ushort)(sVar83 >= sVar63) * sVar63;
  sVar63 = auVar67._10_2_;
  uVar74 = (ushort)(sVar84 < sVar63) * sVar84 | (ushort)(sVar84 >= sVar63) * sVar63;
  sVar63 = auVar67._12_2_;
  sVar64 = auVar67._14_2_;
  uVar75 = (ushort)(sVar85 < sVar63) * sVar85 | (ushort)(sVar85 >= sVar63) * sVar63;
  uVar76 = (ushort)(sVar6 < sVar64) * sVar6 | (ushort)(sVar6 >= sVar64) * sVar64;
  auVar106._0_2_ = (ushort)((short)uVar66 < sVar42) * sVar42 | ((short)uVar66 >= sVar42) * uVar66;
  auVar106._2_2_ = (ushort)((short)uVar70 < sVar43) * sVar43 | ((short)uVar70 >= sVar43) * uVar70;
  auVar106._4_2_ = (ushort)((short)uVar71 < sVar46) * sVar46 | ((short)uVar71 >= sVar46) * uVar71;
  auVar106._6_2_ = (ushort)((short)uVar72 < sVar45) * sVar45 | ((short)uVar72 >= sVar45) * uVar72;
  auVar106._8_2_ = (ushort)((short)uVar73 < sVar56) * sVar56 | ((short)uVar73 >= sVar56) * uVar73;
  auVar106._10_2_ = (ushort)((short)uVar74 < sVar60) * sVar60 | ((short)uVar74 >= sVar60) * uVar74;
  auVar106._12_2_ = (ushort)((short)uVar75 < sVar61) * sVar61 | ((short)uVar75 >= sVar61) * uVar75;
  auVar106._14_2_ = (ushort)((short)uVar76 < sVar62) * sVar62 | ((short)uVar76 >= sVar62) * uVar76;
  auVar86 = paddsw(auVar94,auVar91);
  auVar67 = paddsw(auVar106,auVar91);
  auVar26._8_8_ = uVar5;
  auVar26._0_8_ = uVar4;
  auVar28._8_8_ = uStack_a0;
  auVar28._0_8_ = *(undefined8 *)(s + -lVar38);
  auVar57 = psubusw(auVar28,auVar26);
  auVar89 = psubusw(auVar26,auVar28);
  auVar89 = auVar89 | auVar57;
  auVar27._8_8_ = uStack_90;
  auVar27._0_8_ = *(undefined8 *)(s + -(long)(p * 4));
  auVar90 = psubusw(auVar27,auVar26);
  auVar57 = psubusw(auVar26,auVar27);
  auVar57 = auVar57 | auVar90;
  sVar42 = auVar89._0_2_;
  sVar43 = auVar57._0_2_;
  uVar66 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._2_2_;
  sVar43 = auVar57._2_2_;
  uVar70 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._4_2_;
  sVar43 = auVar57._4_2_;
  uVar71 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._6_2_;
  sVar43 = auVar57._6_2_;
  uVar72 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._8_2_;
  sVar43 = auVar57._8_2_;
  uVar73 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._10_2_;
  sVar43 = auVar57._10_2_;
  uVar74 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._12_2_;
  sVar43 = auVar57._12_2_;
  sVar46 = auVar57._14_2_;
  uVar75 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar89._14_2_;
  uVar76 = (ushort)(sVar46 < sVar42) * sVar42 | (ushort)(sVar46 >= sVar42) * sVar46;
  uVar66 = (sVar47 < (short)uVar66) * uVar66 | (ushort)(sVar47 >= (short)uVar66) * sVar47;
  uVar70 = (sVar49 < (short)uVar70) * uVar70 | (ushort)(sVar49 >= (short)uVar70) * sVar49;
  uVar71 = (sVar48 < (short)uVar71) * uVar71 | (ushort)(sVar48 >= (short)uVar71) * sVar48;
  uVar72 = (sVar50 < (short)uVar72) * uVar72 | (ushort)(sVar50 >= (short)uVar72) * sVar50;
  uVar73 = (sVar52 < (short)uVar73) * uVar73 | (ushort)(sVar52 >= (short)uVar73) * sVar52;
  uVar74 = (sVar51 < (short)uVar74) * uVar74 | (ushort)(sVar51 >= (short)uVar74) * sVar51;
  uVar75 = (sVar53 < (short)uVar75) * uVar75 | (ushort)(sVar53 >= (short)uVar75) * sVar53;
  uVar76 = (sVar54 < (short)uVar76) * uVar76 | (ushort)(sVar54 >= (short)uVar76) * sVar54;
  auVar57 = psllw(_DAT_00517a00,auVar96);
  auVar96._0_2_ =
       ((short)uVar73 < (short)uVar66) * uVar66 | ((short)uVar73 >= (short)uVar66) * uVar73;
  auVar96._2_2_ =
       ((short)uVar74 < (short)uVar70) * uVar70 | ((short)uVar74 >= (short)uVar70) * uVar74;
  auVar96._4_2_ =
       ((short)uVar75 < (short)uVar71) * uVar71 | ((short)uVar75 >= (short)uVar71) * uVar75;
  auVar96._6_2_ =
       ((short)uVar76 < (short)uVar72) * uVar72 | ((short)uVar76 >= (short)uVar72) * uVar76;
  auVar96._8_2_ = (0 < (short)uVar73) * uVar73;
  auVar96._10_2_ = (0 < (short)uVar74) * uVar74;
  auVar96._12_2_ = (0 < (short)uVar75) * uVar75;
  auVar96._14_2_ = (0 < (short)uVar76) * uVar76;
  auVar57 = psubusw(auVar96,auVar57);
  auVar59._0_2_ = -(ushort)(auVar57._0_2_ == 0);
  auVar59._2_2_ = -(ushort)(auVar57._2_2_ == 0);
  auVar59._4_2_ = -(ushort)(auVar57._4_2_ == 0);
  auVar59._6_2_ = -(ushort)(auVar57._6_2_ == 0);
  auVar59._8_2_ = -(ushort)(auVar57._8_2_ == 0);
  auVar59._10_2_ = -(ushort)(auVar57._10_2_ == 0);
  auVar59._12_2_ = -(ushort)(auVar57._12_2_ == 0);
  auVar59._14_2_ = -(ushort)(auVar57._14_2_ == 0);
  auVar59 = auVar59 & auVar108;
  auVar69._0_8_ = auVar59._0_8_;
  auVar69._8_4_ = auVar59._0_4_;
  auVar69._12_4_ = auVar59._4_4_;
  auVar79._0_2_ = -(ushort)(auVar59._0_2_ == 0);
  auVar79._2_2_ = -(ushort)(auVar59._2_2_ == 0);
  auVar79._4_2_ = -(ushort)(auVar59._4_2_ == 0);
  auVar79._6_2_ = -(ushort)(auVar59._6_2_ == 0);
  auVar79._8_2_ = -(ushort)(auVar59._0_2_ == 0);
  auVar79._10_2_ = -(ushort)(auVar59._2_2_ == 0);
  auVar79._12_2_ = -(ushort)(auVar59._4_2_ == 0);
  auVar79._14_2_ = -(ushort)(auVar59._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) | (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar79._14_2_ >> 7) & 1) << 0xe | auVar79._14_2_ & 0x8000) != 0xffff
     ) {
    pq[1][1]._0_2_ = (short)uVar1;
    pq[1][1]._2_2_ = (short)((ulong)uVar1 >> 0x10);
    pq[1][1]._4_2_ = (short)((ulong)uVar1 >> 0x20);
    pq[1][1]._6_2_ = (short)((ulong)uVar1 >> 0x30);
    local_d8 = (short)uVar77;
    sStack_d6 = (short)((ulong)uVar77 >> 0x10);
    sStack_d4 = (short)((ulong)uVar77 >> 0x20);
    sStack_d2 = (short)((ulong)uVar77 >> 0x30);
    pq[0][1]._0_2_ = (short)uVar2;
    pq[0][1]._2_2_ = (short)((ulong)uVar2 >> 0x10);
    pq[0][1]._4_2_ = (short)((ulong)uVar2 >> 0x20);
    pq[0][1]._6_2_ = (short)((ulong)uVar2 >> 0x30);
    sVar47 = (short)((ulong)uVar3 >> 0x10);
    sVar50 = (short)((ulong)uVar3 >> 0x20);
    sVar53 = (short)((ulong)uVar3 >> 0x30);
    sVar42 = (short)pq[1][1] * 2 + local_d8 + (short)pq[0][1] + (short)uVar3 + 4;
    sVar45 = pq[1][1]._2_2_ * 2 + sStack_d6 + pq[0][1]._2_2_ + sVar47 + 4;
    sVar48 = pq[1][1]._4_2_ * 2 + sStack_d4 + pq[0][1]._4_2_ + sVar50 + 4;
    sVar51 = pq[1][1]._6_2_ * 2 + sStack_d2 + pq[0][1]._6_2_ + sVar53 + 4;
    sVar81 = (short)uVar5;
    sVar83 = (short)((ulong)uVar5 >> 0x10);
    sVar84 = (short)((ulong)uVar5 >> 0x20);
    sVar85 = (short)((ulong)uVar5 >> 0x30);
    sStack_78 = (short)uStack_b0;
    sStack_76 = (short)((ulong)uStack_b0 >> 0x10);
    sStack_74 = (short)((ulong)uStack_b0 >> 0x20);
    sStack_72 = (short)((ulong)uStack_b0 >> 0x30);
    sVar56 = sVar81 + sStack_78;
    sVar60 = sVar83 + sStack_76;
    sVar61 = sVar84 + sStack_74;
    sVar62 = sVar85 + sStack_72;
    sVar43 = (sVar42 - (short)pq[1][1]) + (short)uStack_a0;
    sVar63 = (short)((ulong)uStack_a0 >> 0x10);
    sVar46 = (sVar45 - pq[1][1]._2_2_) + sVar63;
    sVar64 = (short)((ulong)uStack_a0 >> 0x20);
    sVar49 = (sVar48 - pq[1][1]._4_2_) + sVar64;
    sVar65 = (short)((ulong)uStack_a0 >> 0x30);
    sVar52 = (sVar51 - pq[1][1]._6_2_) + sVar65;
    auVar55._0_2_ = (ushort)((short)uVar3 + sVar56 + sVar43) >> 3;
    auVar55._2_2_ = (ushort)(sVar47 + sVar60 + sVar46) >> 3;
    auVar55._4_2_ = (ushort)(sVar50 + sVar61 + sVar49) >> 3;
    auVar55._6_2_ = (ushort)(sVar53 + sVar62 + sVar52) >> 3;
    auVar55._8_2_ = (ushort)(sVar56 + (short)pq[0][1] + sVar42) >> 3;
    auVar55._10_2_ = (ushort)(sVar60 + pq[0][1]._2_2_ + sVar45) >> 3;
    auVar55._12_2_ = (ushort)(sVar61 + pq[0][1]._4_2_ + sVar48) >> 3;
    auVar55._14_2_ = (ushort)(sVar62 + pq[0][1]._6_2_ + sVar51) >> 3;
    local_88 = (short)uStack_90;
    sStack_86 = (short)((ulong)uStack_90 >> 0x10);
    sStack_84 = (short)((ulong)uStack_90 >> 0x20);
    sStack_82 = (short)((ulong)uStack_90 >> 0x30);
    sVar43 = (sVar43 - (short)pq[1][1]) + local_88;
    sVar47 = (sVar46 - pq[1][1]._2_2_) + sStack_86;
    sVar50 = (sVar49 - pq[1][1]._4_2_) + sStack_84;
    sVar53 = (sVar52 - pq[1][1]._6_2_) + sStack_82;
    sVar46 = (sVar43 - local_d8) + local_88;
    sVar49 = (sVar47 - sStack_d6) + sStack_86;
    sVar52 = (sVar50 - sStack_d4) + sStack_84;
    sVar54 = (sVar53 - sStack_d2) + sStack_82;
    auVar82._0_2_ = (ushort)(sVar81 + sVar56 + sVar43) >> 3;
    auVar82._2_2_ = (ushort)(sVar83 + sVar60 + sVar47) >> 3;
    auVar82._4_2_ = (ushort)(sVar84 + sVar61 + sVar50) >> 3;
    auVar82._6_2_ = (ushort)(sVar85 + sVar62 + sVar53) >> 3;
    auVar82._8_2_ = (ushort)(sStack_78 + sVar56 + sVar46) >> 3;
    auVar82._10_2_ = (ushort)(sStack_76 + sVar60 + sVar49) >> 3;
    auVar82._12_2_ = (ushort)(sStack_74 + sVar61 + sVar52) >> 3;
    auVar82._14_2_ = (ushort)(sStack_72 + sVar62 + sVar54) >> 3;
    auVar80._0_2_ = (ushort)(local_d8 + (short)pq[1][1] + sVar81 + sVar42) >> 3;
    auVar80._2_2_ = (ushort)(sStack_d6 + pq[1][1]._2_2_ + sVar83 + sVar45) >> 3;
    auVar80._4_2_ = (ushort)(sStack_d4 + pq[1][1]._4_2_ + sVar84 + sVar48) >> 3;
    auVar80._6_2_ = (ushort)(sStack_d2 + pq[1][1]._6_2_ + sVar85 + sVar51) >> 3;
    auVar80._8_2_ =
         (ushort)((((short)uStack_a0 + local_88) - (short)pq[0][1]) + sVar56 + sVar46) >> 3;
    auVar80._10_2_ = (ushort)(((sVar63 + sStack_86) - pq[0][1]._2_2_) + sVar60 + sVar49) >> 3;
    auVar80._12_2_ = (ushort)(((sVar64 + sStack_84) - pq[0][1]._4_2_) + sVar61 + sVar52) >> 3;
    auVar80._14_2_ = (ushort)(((sVar65 + sStack_82) - pq[0][1]._6_2_) + sVar62 + sVar54) >> 3;
    auVar86 = auVar82 & auVar69 | ~auVar69 & auVar86;
    auVar67 = auVar55 & auVar69 | ~auVar69 & auVar67;
    auVar57 = auVar80 & auVar69 | ~auVar69 & auVar28;
    uVar77 = auVar57._0_8_;
    uStack_a0 = auVar57._8_8_;
  }
  *(undefined8 *)(s + -lVar38) = uVar77;
  *(long *)(s + -lVar41) = auVar67._8_8_;
  *(long *)(s + -lVar39) = auVar67._0_8_;
  *(long *)s = auVar86._0_8_;
  *(long *)(s + lVar39) = auVar86._8_8_;
  *(undefined8 *)(s + lVar41) = uStack_a0;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_8_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p3, q3;
  __m128i q1q0, p1p0;

  p3 = _mm_loadl_epi64((__m128i *)(s - 4 * p));
  q3 = _mm_loadl_epi64((__m128i *)(s + 3 * p));
  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));

  highbd_lpf_internal_8_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0,
                             &p1p0, _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 3 * p), p2);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
  _mm_storel_epi64((__m128i *)(s + 2 * p), q2);
}